

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartElementNS
              (xmlTextWriterPtr writer,xmlChar *prefix,xmlChar *name,xmlChar *namespaceURI)

{
  xmlChar *pxVar1;
  undefined8 *data;
  xmlLinkPtr pxVar2;
  xmlTextWriterNsStackEntry *p;
  xmlChar *buf;
  int sum;
  int count;
  xmlChar *namespaceURI_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (name == (xmlChar *)0x0)) || (*name == '\0')) {
    writer_local._4_4_ = -1;
  }
  else {
    p = (xmlTextWriterNsStackEntry *)0x0;
    if (prefix != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(prefix);
      p = (xmlTextWriterNsStackEntry *)xmlStrcat(pxVar1,":");
    }
    pxVar1 = xmlStrcat((xmlChar *)p,name);
    writer_local._4_4_ = xmlTextWriterStartElement(writer,pxVar1);
    (*xmlFree)(pxVar1);
    if (writer_local._4_4_ < 0) {
      writer_local._4_4_ = -1;
    }
    else if (namespaceURI != (xmlChar *)0x0) {
      data = (undefined8 *)(*xmlMalloc)(0x18);
      if (data == (undefined8 *)0x0) {
        xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElementNS : out of memory!\n");
        writer_local._4_4_ = -1;
      }
      else {
        p = (xmlTextWriterNsStackEntry *)xmlStrdup("xmlns");
        if (prefix != (xmlChar *)0x0) {
          pxVar1 = xmlStrcat((xmlChar *)p,":");
          p = (xmlTextWriterNsStackEntry *)xmlStrcat(pxVar1,prefix);
        }
        *data = p;
        pxVar1 = xmlStrdup(namespaceURI);
        data[1] = pxVar1;
        if (data[1] == 0) {
          xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElementNS : out of memory!\n")
          ;
          (*xmlFree)(data);
          writer_local._4_4_ = -1;
        }
        else {
          pxVar2 = xmlListFront(writer->nodes);
          data[2] = pxVar2;
          xmlListPushFront(writer->nsstack,data);
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartElementNS(xmlTextWriterPtr writer,
                            const xmlChar * prefix, const xmlChar * name,
                            const xmlChar * namespaceURI)
{
    int count;
    int sum;
    xmlChar *buf;

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        return -1;

    buf = NULL;
    if (prefix != 0) {
        buf = xmlStrdup(prefix);
        buf = xmlStrcat(buf, BAD_CAST ":");
    }
    buf = xmlStrcat(buf, name);

    sum = 0;
    count = xmlTextWriterStartElement(writer, buf);
    xmlFree(buf);
    if (count < 0)
        return -1;
    sum += count;

    if (namespaceURI != 0) {
        xmlTextWriterNsStackEntry *p = (xmlTextWriterNsStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterNsStackEntry));
        if (p == 0) {
            xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                            "xmlTextWriterStartElementNS : out of memory!\n");
            return -1;
        }

        buf = xmlStrdup(BAD_CAST "xmlns");
        if (prefix != 0) {
            buf = xmlStrcat(buf, BAD_CAST ":");
            buf = xmlStrcat(buf, prefix);
        }

        p->prefix = buf;
        p->uri = xmlStrdup(namespaceURI);
        if (p->uri == 0) {
            xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                            "xmlTextWriterStartElementNS : out of memory!\n");
            xmlFree(p);
            return -1;
        }
        p->elem = xmlListFront(writer->nodes);

        xmlListPushFront(writer->nsstack, p);
    }

    return sum;
}